

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O1

void __thiscall
LongsEqualFailure::LongsEqualFailure
          (LongsEqualFailure *this,UtestShell *test,char *fileName,int lineNumber,long expected,
          long actual,SimpleString *text)

{
  SimpleString *this_00;
  char *pcVar1;
  char *pcVar2;
  SimpleString aDecimal;
  SimpleString expectedReported;
  SimpleString eHex;
  SimpleString eDecimal;
  SimpleString aHex;
  SimpleString actualReported;
  SimpleString local_60;
  SimpleString local_58;
  SimpleString local_50;
  SimpleString local_48;
  SimpleString local_40;
  SimpleString local_38;
  SimpleString local_30;
  SimpleString local_28;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_001dfb48;
  TestFailure::createUserText((TestFailure *)&local_58,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&local_58);
  SimpleString::~SimpleString(&local_58);
  StringFrom((long)&local_58);
  HexStringFrom((long)&local_38);
  StringFrom((long)&local_40);
  HexStringFrom((long)&local_48);
  SimpleString::padStringsToSameLength(&local_58,&local_40,' ');
  SimpleString::padStringsToSameLength(&local_38,&local_48,'0');
  SimpleString::SimpleString(&local_60," 0x");
  SimpleString::operator+(&local_50,&local_58);
  SimpleString::operator+(&local_28,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_30," 0x");
  SimpleString::operator+(&local_60,&local_40);
  SimpleString::operator+(&local_50,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_30);
  pcVar1 = SimpleString::asCharString(&local_50);
  pcVar2 = SimpleString::asCharString(&local_28);
  StringFromFormat((char *)&local_60,"expected <%s>\n\tbut was  <%s>",pcVar1,pcVar2);
  SimpleString::operator+=(this_00,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

LongsEqualFailure::LongsEqualFailure(UtestShell* test, const char* fileName, int lineNumber, long expected, long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString aHex = HexStringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);
    SimpleString eHex = HexStringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');
    SimpleString::padStringsToSameLength(aHex, eHex, '0');

    SimpleString actualReported = aDecimal + " 0x" + aHex;
    SimpleString expectedReported = eDecimal + " 0x" + eHex;
    message_ += createButWasString(expectedReported, actualReported);
}